

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

SchnorrKeyPairDataStruct * __thiscall
cfd::js::api::json::SchnorrKeyPairData::ConvertToStruct
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,SchnorrKeyPairData *this)

{
  SchnorrKeyPairData *this_local;
  SchnorrKeyPairDataStruct *result;
  
  SchnorrKeyPairDataStruct::SchnorrKeyPairDataStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->pubkey_);
  __return_storage_ptr__->parity = (bool)(this->parity_ & 1);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->privkey,(string *)&this->privkey_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

SchnorrKeyPairDataStruct SchnorrKeyPairData::ConvertToStruct() const {  // NOLINT
  SchnorrKeyPairDataStruct result;
  result.pubkey = pubkey_;
  result.parity = parity_;
  result.privkey = privkey_;
  result.ignore_items = ignore_items;
  return result;
}